

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eliminate_dead_members_pass.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::EliminateDeadMembersPass::UpdateCompsiteExtract
          (EliminateDeadMembersPass *this,Instruction *inst)

{
  Op OVar1;
  EliminateDeadMembersPass *this_00;
  uint32_t uVar2;
  uint32_t uVar3;
  DefUseManager *pDVar4;
  Instruction *pIVar5;
  Operand *__args;
  uint index;
  bool bVar6;
  uint32_t uVar7;
  bool bVar8;
  initializer_list<unsigned_int> init_list;
  uint32_t local_bc;
  EliminateDeadMembersPass *local_b8;
  Instruction *local_b0;
  OperandList new_operands;
  Operand local_88;
  SmallVector<unsigned_int,_2UL> local_58;
  
  uVar7 = 0;
  uVar2 = 0;
  if (inst->opcode_ == OpCompositeExtract) {
LAB_004b639e:
    uVar3 = Instruction::GetSingleWordInOperand(inst,uVar2);
    local_b8 = this;
    pDVar4 = Pass::get_def_use_mgr((Pass *)this);
    pIVar5 = analysis::DefUseManager::GetDef(pDVar4,uVar3);
    uVar3 = Instruction::type_id(pIVar5);
    new_operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    new_operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    new_operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    index = uVar2 + 1;
    for (; index != uVar7; uVar7 = uVar7 + 1) {
      __args = Instruction::GetInOperand(inst,uVar7);
      std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
      emplace_back<spvtools::opt::Operand&>
                ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)
                 &new_operands,__args);
    }
    bVar6 = false;
    local_b0 = inst;
    do {
      pIVar5 = local_b0;
      uVar2 = Instruction::NumInOperands(local_b0);
      if (uVar2 <= index) {
        if (bVar6 != false) {
          Instruction::SetInOperands(pIVar5,&new_operands);
          IRContext::UpdateDefUse((local_b8->super_MemPass).super_Pass.context_,pIVar5);
        }
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                  (&new_operands);
        return bVar6;
      }
      uVar2 = Instruction::GetSingleWordInOperand(pIVar5,index);
      this_00 = local_b8;
      uVar7 = GetNewMemberIndex(local_b8,uVar3,uVar2);
      if (uVar7 == 0xffffffff) {
        __assert_fail("new_member_idx != kRemovedMember",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/eliminate_dead_members_pass.cpp"
                      ,0x241,
                      "bool spvtools::opt::EliminateDeadMembersPass::UpdateCompsiteExtract(Instruction *)"
                     );
      }
      bVar8 = uVar2 != uVar7;
      init_list._M_len = 1;
      init_list._M_array = &local_bc;
      local_bc = uVar7;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_58,init_list);
      local_88.type = SPV_OPERAND_TYPE_LITERAL_INTEGER;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_88.words,&local_58);
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
      emplace_back<spvtools::opt::Operand>(&new_operands,&local_88);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_88.words);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_58);
      pDVar4 = Pass::get_def_use_mgr((Pass *)this_00);
      pIVar5 = analysis::DefUseManager::GetDef(pDVar4,uVar3);
      OVar1 = pIVar5->opcode_;
      if (OVar1 < OpTypeOpaque) {
        if ((0x31800000U >> (OVar1 & OpTypeOpaque) & 1) != 0) goto LAB_004b64c9;
        if (OVar1 != OpTypeStruct) goto LAB_004b64f4;
      }
      else {
LAB_004b64f4:
        if (((OVar1 != OpTypeCooperativeMatrixKHR) && (OVar1 != OpTypeCooperativeMatrixNV)) &&
           (OVar1 != OpTypeCooperativeVectorNV)) {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/eliminate_dead_members_pass.cpp"
                        ,0x259,
                        "bool spvtools::opt::EliminateDeadMembersPass::UpdateCompsiteExtract(Instruction *)"
                       );
        }
LAB_004b64c9:
        uVar7 = 0;
      }
      bVar6 = (bool)(bVar6 | bVar8);
      uVar3 = Instruction::GetSingleWordInOperand(pIVar5,uVar7);
      index = index + 1;
    } while( true );
  }
  if (inst->opcode_ == OpSpecConstantOp) {
    uVar2 = Instruction::GetSingleWordInOperand(inst,0);
    if (uVar2 == 0x51) {
      uVar2 = (uint32_t)(inst->opcode_ == OpSpecConstantOp);
      goto LAB_004b639e;
    }
  }
  __assert_fail("inst->opcode() == spv::Op::OpCompositeExtract || (inst->opcode() == spv::Op::OpSpecConstantOp && spv::Op(inst->GetSingleWordInOperand(kSpecConstOpOpcodeIdx)) == spv::Op::OpCompositeExtract)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/eliminate_dead_members_pass.cpp"
                ,0x22f,
                "bool spvtools::opt::EliminateDeadMembersPass::UpdateCompsiteExtract(Instruction *)"
               );
}

Assistant:

bool EliminateDeadMembersPass::UpdateCompsiteExtract(Instruction* inst) {
  assert(inst->opcode() == spv::Op::OpCompositeExtract ||
         (inst->opcode() == spv::Op::OpSpecConstantOp &&
          spv::Op(inst->GetSingleWordInOperand(kSpecConstOpOpcodeIdx)) ==
              spv::Op::OpCompositeExtract));

  uint32_t first_operand = 0;
  if (inst->opcode() == spv::Op::OpSpecConstantOp) {
    first_operand = 1;
  }
  uint32_t object_id = inst->GetSingleWordInOperand(first_operand);
  Instruction* object_inst = get_def_use_mgr()->GetDef(object_id);
  uint32_t type_id = object_inst->type_id();

  Instruction::OperandList new_operands;
  bool modified = false;
  for (uint32_t i = 0; i < first_operand + 1; i++) {
    new_operands.emplace_back(inst->GetInOperand(i));
  }
  for (uint32_t i = first_operand + 1; i < inst->NumInOperands(); ++i) {
    uint32_t member_idx = inst->GetSingleWordInOperand(i);
    uint32_t new_member_idx = GetNewMemberIndex(type_id, member_idx);
    assert(new_member_idx != kRemovedMember);
    if (member_idx != new_member_idx) {
      modified = true;
    }
    new_operands.emplace_back(
        Operand({SPV_OPERAND_TYPE_LITERAL_INTEGER, {new_member_idx}}));

    Instruction* type_inst = get_def_use_mgr()->GetDef(type_id);
    switch (type_inst->opcode()) {
      case spv::Op::OpTypeStruct:
        // The type will have already been rewritten, so use the new member
        // index.
        type_id = type_inst->GetSingleWordInOperand(new_member_idx);
        break;
      case spv::Op::OpTypeArray:
      case spv::Op::OpTypeRuntimeArray:
      case spv::Op::OpTypeVector:
      case spv::Op::OpTypeMatrix:
      case spv::Op::OpTypeCooperativeMatrixNV:
      case spv::Op::OpTypeCooperativeMatrixKHR:
      case spv::Op::OpTypeCooperativeVectorNV:
        type_id = type_inst->GetSingleWordInOperand(0);
        break;
      default:
        assert(false);
    }
  }

  if (!modified) {
    return false;
  }
  inst->SetInOperands(std::move(new_operands));
  context()->UpdateDefUse(inst);
  return true;
}